

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktFragmentOperationsScissorTests.cpp
# Opt level: O0

void vkt::FragmentOperations::anon_unknown_0::initPrograms
               (SourceCollections *programCollection,CaseDef *caseDef)

{
  char *pcVar1;
  ostream *poVar2;
  ProgramSources *pPVar3;
  bool bVar4;
  string local_400;
  ShaderSource local_3e0;
  allocator<char> local_3b1;
  string local_3b0;
  ostringstream local_390 [8];
  ostringstream src_1;
  string local_218;
  ShaderSource local_1f8;
  allocator<char> local_1c9;
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream src;
  bool usePointSize;
  CaseDef *caseDef_local;
  SourceCollections *programCollection_local;
  
  bVar4 = caseDef->primitive == TEST_PRIMITIVE_POINTS;
  std::__cxx11::ostringstream::ostringstream(local_198);
  pcVar1 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar2 = std::operator<<((ostream *)local_198,pcVar1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) in  vec4 in_position;\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 1) in  vec4 in_color;\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) out vec4 o_color;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"out gl_PerVertex {\n");
  poVar2 = std::operator<<(poVar2,"    vec4  gl_Position;\n");
  pcVar1 = "";
  if (bVar4) {
    pcVar1 = "    float gl_PointSize;\n";
  }
  poVar2 = std::operator<<(poVar2,pcVar1);
  poVar2 = std::operator<<(poVar2,"};\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"void main(void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"    gl_Position  = in_position;\n");
  pcVar1 = "";
  if (bVar4) {
    pcVar1 = "    gl_PointSize = 1.0;\n";
  }
  poVar2 = std::operator<<(poVar2,pcVar1);
  poVar2 = std::operator<<(poVar2,"    o_color      = in_color;\n");
  std::operator<<(poVar2,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"vert",&local_1c9);
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_1c8);
  std::__cxx11::ostringstream::str();
  glu::VertexSource::VertexSource((VertexSource *)&local_1f8,&local_218);
  glu::ProgramSources::operator<<(pPVar3,&local_1f8);
  glu::VertexSource::~VertexSource((VertexSource *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::__cxx11::ostringstream::ostringstream(local_390);
  pcVar1 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar2 = std::operator<<((ostream *)local_390,pcVar1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) in  vec4 in_color;\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) out vec4 o_color;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"void main(void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"    o_color = in_color;\n");
  std::operator<<(poVar2,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b0,"frag",&local_3b1);
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_3b0);
  std::__cxx11::ostringstream::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_3e0,&local_400);
  glu::ProgramSources::operator<<(pPVar3,&local_3e0);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_3e0);
  std::__cxx11::string::~string((string *)&local_400);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::allocator<char>::~allocator(&local_3b1);
  std::__cxx11::ostringstream::~ostringstream(local_390);
  return;
}

Assistant:

void initPrograms (SourceCollections& programCollection, const CaseDef caseDef)
{
	DE_UNREF(caseDef);

	// Vertex shader
	{
		const bool usePointSize = (caseDef.primitive == TEST_PRIMITIVE_POINTS);

		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(location = 0) in  vec4 in_position;\n"
			<< "layout(location = 1) in  vec4 in_color;\n"
			<< "layout(location = 0) out vec4 o_color;\n"
			<< "\n"
			<< "out gl_PerVertex {\n"
			<< "    vec4  gl_Position;\n"
			<< (usePointSize ? "    float gl_PointSize;\n" : "")
			<< "};\n"
			<< "\n"
			<< "void main(void)\n"
			<< "{\n"
			<< "    gl_Position  = in_position;\n"
			<< (usePointSize ? "    gl_PointSize = 1.0;\n" : "")
			<< "    o_color      = in_color;\n"
			<< "}\n";

		programCollection.glslSources.add("vert") << glu::VertexSource(src.str());
	}

	// Fragment shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(location = 0) in  vec4 in_color;\n"
			<< "layout(location = 0) out vec4 o_color;\n"
			<< "\n"
			<< "void main(void)\n"
			<< "{\n"
			<< "    o_color = in_color;\n"
			<< "}\n";

		programCollection.glslSources.add("frag") << glu::FragmentSource(src.str());
	}
}